

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomFourAction::Use(GreenRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  bool bVar4;
  string local_80 [36];
  itemType local_5c [6];
  allocator local_41;
  string local_40 [8];
  string information;
  itemType local_1c;
  GreenRoomFourAction *local_18;
  GreenRoomFourAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == KID) {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    bVar4 = false;
    if (iVar1 != BUCKET) {
      local_1c = CLEAN_BUCKET;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      bVar4 = iVar2 != ACTIVE;
    }
    if (bVar4) {
      this_local = (GreenRoomFourAction *)AbstractRoomAction::Use(&this->super_AbstractRoomAction);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,
                 "The otherworldy child drinks from the clean water basin.You can see strength return until a large burst of light illuminates the room.The room completely changes into vibrant gold colours. You have completed this leg of the journey.The creature now focuses on you, and with a flicker of his eye you hear the words in your ears....GO!\nThe creature vanishes and you see all doors lead back to the main entrance."
                 ,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      local_5c[1] = 0x18;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_5c + 1);
      ItemWrapper::setLocation(pIVar3,HIDDEN);
      local_5c[0] = GREEN_KEY;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_5c);
      ItemWrapper::setLocation(pIVar3,HIDDEN);
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string(local_80,local_40);
      ActionResults::ActionResults(this_00,CURRENT,(string *)local_80,FIREWORKS);
      this_local = (GreenRoomFourAction *)this_00;
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_40);
    }
  }
  else {
    this_local = (GreenRoomFourAction *)AbstractRoomAction::Use(&this->super_AbstractRoomAction);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *GreenRoomFourAction::Use() {

    if(commands->getActedOnItem() != KID)
        return AbstractRoomAction::Use();
    else {
        if (commands->getMainItem() != BUCKET && itemList->getValue(CLEAN_BUCKET)->getLocation() != ACTIVE) {
            return AbstractRoomAction::Use();
        } else {

            std::string information = "The otherworldy child drinks from the clean water basin."
                    "You can see strength return until a large burst of light illuminates the room."
                    "The room completely changes into vibrant gold colours. You have completed this leg of the journey."
                    "The creature now focuses on you, and with a flicker of his eye you hear the words in your ears....GO!\n"
                    "The creature vanishes and you see all doors lead back to the main entrance.";
            itemList->getValue(KID)->setLocation(HIDDEN);
            itemList->getValue(GREEN_KEY)->setLocation(HIDDEN);
            return new ActionResults(CURRENT, information, FIREWORKS);
        }
    }
}